

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O1

void Gia_ManSimSetDefaultParams(Gia_ParSim_t *p)

{
  p->nWords = 0;
  p->nIters = 0;
  p->RandSeed = 0;
  p->TimeLimit = 0;
  p->TimeLimit = 0;
  p->fCheckMiter = 0;
  p->fVerbose = 0;
  p->iOutFail = 0;
  p->nWords = 8;
  p->nIters = 0x20;
  p->RandSeed = 0;
  p->TimeLimit = 0x3c;
  p->fCheckMiter = 0;
  p->fVerbose = 0;
  p->iOutFail = -1;
  return;
}

Assistant:

void Gia_ManSimSetDefaultParams( Gia_ParSim_t * p )
{
    memset( p, 0, sizeof(Gia_ParSim_t) );
    // user-controlled parameters
    p->nWords       =   8;    // the number of machine words
    p->nIters       =  32;    // the number of timeframes
    p->RandSeed     =   0;    // the seed to generate random numbers
    p->TimeLimit    =  60;    // time limit in seconds
    p->fCheckMiter  =   0;    // check if miter outputs are non-zero 
    p->fVerbose     =   0;    // enables verbose output
    p->iOutFail     =  -1;    // index of the failed output
}